

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O0

void wasm::PrintExpressionContents::printRMWSize(ostream *o,Type type,uint8_t bytes)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  ostream *poVar4;
  bool bVar5;
  BasicType local_34;
  ostream *local_30;
  uintptr_t local_28;
  byte local_19;
  ostream *poStack_18;
  uint8_t bytes_local;
  ostream *o_local;
  Type type_local;
  
  local_19 = bytes;
  poStack_18 = o;
  o_local = (ostream *)type.id;
  poVar4 = prepareColor(o);
  local_30 = o_local;
  local_28 = (uintptr_t)forceConcrete((Type)o_local);
  poVar4 = wasm::operator<<(poVar4,(Type)local_28);
  std::operator<<(poVar4,".atomic.rmw");
  local_34 = unreachable;
  bVar1 = wasm::Type::operator!=((Type *)&o_local,&local_34);
  bVar5 = false;
  if (bVar1) {
    uVar2 = (uint)local_19;
    uVar3 = wasm::Type::getByteSize((Type *)&o_local);
    bVar5 = uVar2 != uVar3;
  }
  if (bVar5) {
    if (local_19 == 1) {
      std::operator<<(poStack_18,'8');
    }
    else if (local_19 == 2) {
      std::operator<<(poStack_18,"16");
    }
    else {
      if (local_19 != 4) {
        handle_unreachable("invalid RMW byte length",
                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Print.cpp"
                           ,0x29d);
      }
      std::operator<<(poStack_18,"32");
    }
  }
  std::operator<<(poStack_18,'.');
  return;
}

Assistant:

static void printRMWSize(std::ostream& o, Type type, uint8_t bytes) {
    prepareColor(o) << forceConcrete(type) << ".atomic.rmw";
    if (type != Type::unreachable && bytes != type.getByteSize()) {
      if (bytes == 1) {
        o << '8';
      } else if (bytes == 2) {
        o << "16";
      } else if (bytes == 4) {
        o << "32";
      } else {
        WASM_UNREACHABLE("invalid RMW byte length");
      }
    }
    o << '.';
  }